

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O3

_Bool XCore_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  uint8_t *puVar2;
  DecodeStatus DVar3;
  uint8_t *orig_p;
  ulong uVar4;
  MCRegisterClass *pMVar5;
  byte bVar6;
  void *pvVar7;
  ulong uVar8;
  uint64_t Value_3;
  long lVar9;
  long lVar10;
  uint uVar11;
  byte *pbVar12;
  uint8_t *puVar13;
  uint uVar14;
  uint64_t Value_4;
  uint64_t Value_1;
  uint16_t uVar15;
  uint16_t uVar16;
  ushort uVar17;
  uint uVar18;
  
  if (code_len < 2) {
    return false;
  }
  uVar17 = *(ushort *)code;
  uVar18 = (uint)uVar17;
  __s = MI->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0xdc);
  }
  uVar11 = 0;
  puVar2 = "\x01\v\x05\x02";
  do {
    puVar13 = puVar2;
    switch(*puVar13) {
    case '\x01':
      uVar11 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
      if (puVar13[2] == 0x10) {
        uVar11 = 0xffff;
      }
      uVar11 = (uVar11 & uVar18) >> (puVar13[1] & 0x1f);
      puVar2 = puVar13 + 3;
      break;
    case '\x02':
      uVar4 = 0;
      lVar10 = 0;
      bVar6 = 0;
      do {
        lVar9 = uVar4 + 1;
        lVar10 = lVar10 + ((ulong)(puVar13[lVar9] & 0x7f) << (bVar6 & 0x3f));
        bVar6 = bVar6 + 7;
        uVar4 = uVar4 + 1;
      } while ((char)puVar13[lVar9] < '\0');
      puVar2 = puVar13 + (uVar4 & 0xffffffff) + 3;
      if (((uint)lVar10 & 0xffff) != uVar11) {
        puVar2 = puVar13 + (uVar4 & 0xffffffff) + 3 +
                 *(ushort *)(puVar13 + (uVar4 & 0xffffffff) + 1);
      }
      break;
    case '\x03':
      uVar14 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
      if (puVar13[2] == 0x10) {
        uVar14 = 0xffff;
      }
      uVar4 = 0;
      lVar10 = 0;
      bVar6 = 0;
      do {
        lVar9 = uVar4 + 3;
        lVar10 = lVar10 + ((ulong)(puVar13[lVar9] & 0x7f) << (bVar6 & 0x3f));
        bVar6 = bVar6 + 7;
        uVar4 = uVar4 + 1;
      } while ((char)puVar13[lVar9] < '\0');
      puVar2 = puVar13 + (uVar4 & 0xffffffff) + 5;
      if ((uVar14 & uVar18) >> (puVar13[1] & 0x1f) != (uint)lVar10) {
        puVar2 = puVar13 + (uVar4 & 0xffffffff) + 5 +
                 *(ushort *)(puVar13 + (uVar4 & 0xffffffff) + 3);
      }
      break;
    case '\x04':
      uVar4 = 0;
      do {
        lVar10 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while ((char)puVar13[lVar10] < '\0');
      puVar2 = puVar13 + (uVar4 & 0xffffffff) + 3;
      break;
    case '\x05':
      goto switchD_0024d77d_caseD_5;
    case '\x06':
      uVar4 = 0;
      do {
        lVar10 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while ((char)puVar13[lVar10] < '\0');
      uVar8 = 0;
      do {
        lVar10 = uVar8 + (uVar4 & 0xffffffff) + 1;
        uVar8 = uVar8 + 1;
      } while ((char)puVar13[lVar10] < '\0');
      puVar2 = puVar13 + (uVar8 & 0xffffffff) + (uVar4 & 0xffffffff) + 1;
      break;
    default:
      goto switchD_0024d77d_default;
    }
  } while( true );
switchD_0024d77d_caseD_5:
  uVar4 = 0;
  lVar10 = 0;
  bVar6 = 0;
  do {
    lVar9 = uVar4 + 1;
    lVar10 = lVar10 + ((ulong)(puVar13[lVar9] & 0x7f) << (bVar6 & 0x3f));
    bVar6 = bVar6 + 7;
    uVar4 = uVar4 + 1;
  } while ((char)puVar13[lVar9] < '\0');
  pbVar12 = puVar13 + (uVar4 & 0xffffffff) + 1;
  lVar9 = 0;
  bVar6 = 0;
  do {
    bVar1 = *pbVar12;
    lVar9 = lVar9 + ((ulong)(bVar1 & 0x7f) << (bVar6 & 0x3f));
    bVar6 = bVar6 + 7;
    pbVar12 = pbVar12 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,(uint)lVar10);
  uVar16 = 2;
  uVar15 = 2;
  uVar11 = (int)lVar9 - 1;
  if (0x23 < uVar11) goto LAB_0024e0e9;
  pvVar7 = (void *)((long)&switchD_0024d930::switchdataD_00548778 +
                   (long)(int)(&switchD_0024d930::switchdataD_00548778)[uVar11]);
  uVar11 = (uint)uVar17;
  uVar14 = (uint)uVar17;
  switch((int)lVar9) {
  case 1:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar18 & 0xf,(uint64_t)info,pvVar7);
    break;
  case 2:
    DVar3 = Decode2RInstruction(MI,(uint)uVar17,(uint64_t)info,pvVar7);
    break;
  case 3:
    DVar3 = Decode2RUSInstruction(MI,(uint)uVar17,(uint64_t)info,pvVar7);
    break;
  case 4:
    DVar3 = DecodeR2RInstruction(MI,(uint)uVar17,(uint64_t)info,pvVar7);
    break;
  case 5:
    DVar3 = Decode3RInstruction(MI,(uint)uVar17,(uint64_t)info,pvVar7);
    break;
  case 6:
    DVar3 = Decode2RImmInstruction(MI,(uint)uVar17,(uint64_t)info,pvVar7);
    break;
  case 7:
    DVar3 = Decode2RSrcDstInstruction(MI,(uint)uVar17,(uint64_t)info,pvVar7);
    break;
  case 8:
    DVar3 = DecodeRUSSrcDstBitpInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 9:
    DVar3 = DecodeRUSInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 10:
    DVar3 = DecodeRRegsRegisterClass(MI,uVar17 >> 6 & 0xf,(uint64_t)info,pvVar7);
    goto LAB_0024dad0;
  case 0xb:
    goto switchD_0024d930_caseD_b;
  case 0xc:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar17 >> 6 & 0xf,(uint64_t)info,pvVar7);
LAB_0024dad0:
    if (DVar3 != MCDisassembler_Fail) {
      uVar4 = (ulong)(uVar14 & 0x3f);
LAB_0024de10:
      uVar15 = 2;
      goto LAB_0024e0de;
    }
    goto switchD_0024d77d_default;
  case 0xd:
    goto switchD_0024d930_caseD_d;
  case 0xe:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar17 >> 6 & 0xf,(uint64_t)info,pvVar7);
    if (DVar3 != MCDisassembler_Fail) {
      uVar4 = (ulong)(uVar14 & 0x3f);
      goto LAB_0024db57;
    }
    goto switchD_0024d77d_default;
  case 0xf:
    DVar3 = DecodeRUSBitpInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x10:
    DVar3 = Decode2RUSBitpInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x11:
    DVar3 = Decode3RImmInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x12:
    goto switchD_0024d930_caseD_12;
  case 0x13:
    goto switchD_0024d930_caseD_13;
  case 0x14:
    DVar3 = DecodeL2RInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x15:
    DVar3 = DecodeL3RInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x16:
    DVar3 = DecodeL4RSrcDstInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x17:
    DVar3 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x18:
    DVar3 = DecodeL5RInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x19:
    DVar3 = DecodeL6RInstruction(MI,uVar14,(uint64_t)info,pvVar7);
    break;
  case 0x1a:
    DVar3 = DecodeLR2RInstruction(MI,uVar11,(uint64_t)info,pvVar7);
    break;
  case 0x1b:
    uVar18 = 0;
    goto LAB_0024ddf5;
  case 0x1c:
    uVar17 = uVar17 << 6;
    goto LAB_0024d95e;
  case 0x1d:
    uVar18 = 1;
LAB_0024ddf5:
    pMVar5 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar18);
    MCOperand_CreateReg0(MI,(uint)*pMVar5->RegsBegin);
    uVar4 = ((ulong)uVar17 & 0x3ff) << 6;
    goto LAB_0024de10;
  case 0x1e:
    uVar18 = uVar11 << 6;
    goto LAB_0024dde5;
  case 0x1f:
    pMVar5 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,1);
    MCOperand_CreateReg0(MI,(uint)*pMVar5->RegsBegin);
    uVar4 = ((ulong)uVar17 & 0x3ff) << 6;
LAB_0024db57:
    uVar4 = -uVar4;
    goto LAB_0024de10;
  case 0x20:
    DVar3 = DecodeL2RUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar7);
    break;
  case 0x21:
    DVar3 = DecodeL2RUSInstruction(MI,uVar11,(uint64_t)info,pvVar7);
    break;
  case 0x22:
    DVar3 = DecodeL3RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar7);
    break;
  case 0x23:
    uVar17 = uVar17 << 10;
LAB_0024d95e:
    uVar4 = (ulong)uVar17;
    uVar15 = uVar16;
    goto LAB_0024e0de;
  case 0x24:
    uVar18 = uVar18 << 10;
LAB_0024dde5:
    uVar4 = (ulong)(uVar18 & 0xffff);
    goto LAB_0024e0db;
  }
  if (DVar3 == MCDisassembler_Fail) {
switchD_0024d77d_default:
    uVar11 = 0;
    if (3 < code_len) {
      uVar18 = *(uint *)code;
      puVar2 = "\x01\x1b\x05\x02";
      do {
        puVar13 = puVar2;
        switch(*puVar13) {
        case '\x01':
          uVar11 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
          if (puVar13[2] == 0x20) {
            uVar11 = 0xffffffff;
          }
          uVar11 = (uVar11 & uVar18) >> (puVar13[1] & 0x1f);
          puVar2 = puVar13 + 3;
          break;
        case '\x02':
          uVar4 = 0;
          lVar10 = 0;
          bVar6 = 0;
          do {
            lVar9 = uVar4 + 1;
            lVar10 = lVar10 + ((ulong)(puVar13[lVar9] & 0x7f) << (bVar6 & 0x3f));
            bVar6 = bVar6 + 7;
            uVar4 = uVar4 + 1;
          } while ((char)puVar13[lVar9] < '\0');
          puVar2 = puVar13 + (uVar4 & 0xffffffff) + 3;
          if (uVar11 != (uint)lVar10) {
            puVar2 = puVar13 + (uVar4 & 0xffffffff) + 3 +
                     *(ushort *)(puVar13 + (uVar4 & 0xffffffff) + 1);
          }
          break;
        case '\x03':
          uVar14 = ~(-1 << (puVar13[2] & 0x1f)) << (puVar13[1] & 0x1f);
          if (puVar13[2] == 0x20) {
            uVar14 = 0xffffffff;
          }
          uVar4 = 0;
          lVar10 = 0;
          bVar6 = 0;
          do {
            lVar9 = uVar4 + 3;
            lVar10 = lVar10 + ((ulong)(puVar13[lVar9] & 0x7f) << (bVar6 & 0x3f));
            bVar6 = bVar6 + 7;
            uVar4 = uVar4 + 1;
          } while ((char)puVar13[lVar9] < '\0');
          puVar2 = puVar13 + (uVar4 & 0xffffffff) + 5;
          if ((uVar14 & uVar18) >> (puVar13[1] & 0x1f) != (uint)lVar10) {
            puVar2 = puVar13 + (uVar4 & 0xffffffff) + 5 +
                     *(ushort *)(puVar13 + (uVar4 & 0xffffffff) + 3);
          }
          break;
        case '\x04':
          uVar4 = 0;
          do {
            lVar10 = uVar4 + 1;
            uVar4 = uVar4 + 1;
          } while ((char)puVar13[lVar10] < '\0');
          puVar2 = puVar13 + (uVar4 & 0xffffffff) + 3;
          break;
        case '\x05':
          goto switchD_0024dbe7_caseD_5;
        case '\x06':
          uVar4 = 0;
          do {
            lVar10 = uVar4 + 1;
            uVar4 = uVar4 + 1;
          } while ((char)puVar13[lVar10] < '\0');
          uVar8 = 0;
          do {
            lVar10 = uVar8 + (uVar4 & 0xffffffff) + 1;
            uVar8 = uVar8 + 1;
          } while ((char)puVar13[lVar10] < '\0');
          puVar2 = puVar13 + (uVar8 & 0xffffffff) + (uVar4 & 0xffffffff) + 1;
          break;
        default:
          goto switchD_0024dbe7_default;
        }
      } while( true );
    }
    goto LAB_0024e0f3;
  }
  goto LAB_0024e0e9;
switchD_0024dbe7_caseD_5:
  uVar4 = 0;
  lVar10 = 0;
  bVar6 = 0;
  do {
    lVar9 = uVar4 + 1;
    lVar10 = lVar10 + ((ulong)(puVar13[lVar9] & 0x7f) << (bVar6 & 0x3f));
    bVar6 = bVar6 + 7;
    uVar4 = uVar4 + 1;
  } while ((char)puVar13[lVar9] < '\0');
  pbVar12 = puVar13 + (uVar4 & 0xffffffff) + 1;
  lVar9 = 0;
  bVar6 = 0;
  do {
    bVar1 = *pbVar12;
    lVar9 = lVar9 + ((ulong)(bVar1 & 0x7f) << (bVar6 & 0x3f));
    bVar6 = bVar6 + 7;
    pbVar12 = pbVar12 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,(uint)lVar10);
  uVar16 = 4;
  uVar15 = 4;
  uVar11 = (int)lVar9 - 1;
  if (0x23 < uVar11) goto LAB_0024e0e9;
  pvVar7 = (void *)((long)&switchD_0024dd90::switchdataD_00548820 +
                   (long)(int)(&switchD_0024dd90::switchdataD_00548820)[uVar11]);
  switch((int)lVar9) {
  case 1:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar18 & 0xf,(uint64_t)info,pvVar7);
    break;
  case 2:
    DVar3 = Decode2RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 3:
    DVar3 = Decode2RUSInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 4:
    DVar3 = DecodeR2RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 5:
    DVar3 = Decode3RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 6:
    DVar3 = Decode2RImmInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 7:
    DVar3 = Decode2RSrcDstInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 8:
    DVar3 = DecodeRUSSrcDstBitpInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 9:
    DVar3 = DecodeRUSInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 10:
    DVar3 = DecodeRRegsRegisterClass(MI,uVar18 >> 6 & 0xf,(uint64_t)info,pvVar7);
    goto LAB_0024dee8;
  case 0xb:
switchD_0024d930_caseD_b:
    uVar4 = (ulong)(uVar18 & 0x3f);
    uVar15 = uVar16;
    goto LAB_0024e0de;
  case 0xc:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar18 >> 6 & 0xf,(uint64_t)info,pvVar7);
LAB_0024dee8:
    if (DVar3 != MCDisassembler_Fail) {
      uVar4 = (ulong)(uVar18 & 0x3f);
LAB_0024e130:
      uVar15 = 4;
      goto LAB_0024e0de;
    }
    goto switchD_0024dbe7_default;
  case 0xd:
switchD_0024d930_caseD_d:
    uVar4 = (ulong)(uVar18 & 0x3f);
    goto LAB_0024e0db;
  case 0xe:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar18 >> 6 & 0xf,(uint64_t)info,pvVar7);
    if (DVar3 == MCDisassembler_Fail) goto switchD_0024dbe7_default;
    uVar18 = uVar18 & 0x3f;
LAB_0024e059:
    uVar4 = -(ulong)uVar18;
    goto LAB_0024e130;
  case 0xf:
    DVar3 = DecodeRUSBitpInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x10:
    DVar3 = Decode2RUSBitpInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x11:
    DVar3 = Decode3RImmInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x12:
switchD_0024d930_caseD_12:
    uVar4 = (ulong)(uVar18 & 0x3ff);
    uVar15 = uVar16;
    goto LAB_0024e0de;
  case 0x13:
switchD_0024d930_caseD_13:
    uVar4 = (ulong)(uVar18 & 0x3ff);
    goto LAB_0024e0db;
  case 0x14:
    DVar3 = DecodeL2RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x15:
    DVar3 = DecodeL3RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x16:
    DVar3 = DecodeL4RSrcDstInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x17:
    DVar3 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x18:
    DVar3 = DecodeL5RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x19:
    DVar3 = DecodeL6RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x1a:
    DVar3 = DecodeLR2RInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x1b:
    DVar3 = DecodeRRegsRegisterClass(MI,uVar18 >> 0x16 & 0xf,(uint64_t)info,pvVar7);
    goto LAB_0024e118;
  case 0x1c:
    uVar11 = (uVar18 & 0x3ff) << 6;
    uVar18 = uVar18 >> 0x10 & 0x3f;
    goto LAB_0024de5e;
  case 0x1d:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar18 >> 0x16 & 0xf,(uint64_t)info,pvVar7);
LAB_0024e118:
    if (DVar3 != MCDisassembler_Fail) {
      uVar4 = (ulong)(uVar18 >> 0x10 & 0x3f | (uVar18 & 0x3ff) << 6);
      goto LAB_0024e130;
    }
    goto switchD_0024dbe7_default;
  case 0x1e:
    uVar11 = (uVar18 & 0x3ff) << 6;
    uVar18 = uVar18 >> 0x10 & 0x3f;
    goto LAB_0024e0d8;
  case 0x1f:
    DVar3 = DecodeGRRegsRegisterClass(MI,uVar18 >> 0x16 & 0xf,(uint64_t)info,pvVar7);
    if (DVar3 != MCDisassembler_Fail) {
      uVar18 = uVar18 >> 0x10 & 0x3f | (uVar18 & 0x3ff) << 6;
      goto LAB_0024e059;
    }
    goto switchD_0024dbe7_default;
  case 0x20:
    DVar3 = DecodeL2RUSBitpInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x21:
    DVar3 = DecodeL2RUSInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x22:
    DVar3 = DecodeL3RSrcDstInstruction(MI,uVar18,(uint64_t)info,pvVar7);
    break;
  case 0x23:
    uVar11 = (uVar18 & 0x3ff) << 10;
    uVar18 = uVar18 >> 0x10 & 0x3ff;
LAB_0024de5e:
    uVar4 = (ulong)(uVar18 | uVar11);
    uVar15 = uVar16;
    goto LAB_0024e0de;
  case 0x24:
    uVar11 = (uVar18 & 0x3ff) << 10;
    uVar18 = uVar18 >> 0x10 & 0x3ff;
LAB_0024e0d8:
    uVar4 = (ulong)(uVar18 | uVar11);
LAB_0024e0db:
    uVar4 = -uVar4;
    uVar15 = uVar16;
LAB_0024e0de:
    MCOperand_CreateImm0(MI,uVar4);
    goto LAB_0024e0e9;
  }
  if (DVar3 == MCDisassembler_Fail) {
switchD_0024dbe7_default:
    uVar11 = 0;
  }
  else {
LAB_0024e0e9:
    *size = uVar15;
    uVar11 = 1;
  }
LAB_0024e0f3:
  return SUB41(uVar11,0);
}

Assistant:

bool XCore_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint16_t insn16;
	uint32_t insn32;
	DecodeStatus Result;

	if (!readInstruction16(code, code_len, &insn16)) {
		return false;
	}

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, xcore)+sizeof(cs_xcore));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_2(DecoderTable16, MI, insn16, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 2;
		return true;
	}

	if (!readInstruction32(code, code_len, &insn32)) {
		return false;
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_4(DecoderTable32, MI, insn32, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}